

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tagged_union.hpp
# Opt level: O0

void __thiscall
type_safe::tagged_union<int,double,debugger_type>::emplace<debugger_type,debugger_type>
          (tagged_union<int,double,debugger_type> *this,debugger_type *param_2)

{
  debugger_type *this_00;
  type_id index;
  debugger_type *args_local;
  tagged_union<int,_double,_debugger_type> *this_local;
  
  this_00 = (debugger_type *)
            detail::aligned_union<int,_double,_debugger_type>::get
                      ((aligned_union<int,_double,_debugger_type> *)this);
  debugger_type::debugger_type(this_00,param_2);
  *(undefined8 *)(this + 0x10) = 3;
  return;
}

Assistant:

void emplace(union_type<T>, Args&&... args)
    {
        constexpr auto index = type_id(union_type<T>{});
        // MSVC doesn't like operator!= of the strong typedef here, for some reason...
        static_assert(get(index) != get(invalid_type), "T must not be stored in variant");
        static_assert(std::is_constructible<T, Args&&...>::value,
                      "T not constructible from arguments");

        ::new (storage_.get()) T(std::forward<Args>(args)...);
        cur_type_ = index;
    }